

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O1

void __thiscall
cmFindBaseDebugState::FoundAt(cmFindBaseDebugState *this,string *path,string *regexName)

{
  pointer pcVar1;
  string local_80;
  undefined1 local_60 [32];
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  if ((this->FindCommand->super_cmFindCommon).DebugMode == true) {
    pcVar1 = (path->_M_dataplus)._M_p;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar1,pcVar1 + path->_M_string_length);
    DebugLibState::DebugLibState((DebugLibState *)local_60,regexName,&local_80);
    std::__cxx11::string::operator=((string *)&this->FoundSearchLocation,(string *)local_60);
    std::__cxx11::string::operator=((string *)&(this->FoundSearchLocation).path,(string *)&local_40)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_p != &local_30) {
      operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
      operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmFindBaseDebugState::FoundAt(std::string const& path,
                                   std::string regexName)
{
  if (this->FindCommand->DebugMode) {
    this->FoundSearchLocation = DebugLibState{ std::move(regexName), path };
  }
}